

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<int>::GetSetter
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          JavascriptString *propertyNameString,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  byte bVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  uint uVar5;
  int iVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  Var pvVar9;
  DescriptorFlags DVar10;
  undefined1 local_50 [8];
  CharacterBuffer<char16_t> propertyName;
  
  propertyName._8_8_ = setterValue;
  pcVar7 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  bVar3 = PropertyRecord::IsPropertyNameNumeric(pcVar7,cVar4);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ba,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pcVar7 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)local_50);
  local_50 = (undefined1  [8])pcVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_50);
  this_00 = (this->propertyMap).ptr;
  propertyName.string.ptr._0_4_ = cVar4;
  uVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,(CharacterBuffer<char16_t> *)local_50);
  if (-1 < (int)uVar5) {
    this = (DictionaryTypeHandlerBase<int> *)((this_00->entries).ptr + uVar5);
  }
  DVar10 = None;
  if ((-1 < (int)uVar5) &&
     (((ulong)(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler & 0x800) == 0)) {
    iVar6 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
                      ((DictionaryPropertyDescriptor<int> *)this);
    if (iVar6 == -1) {
      iVar6 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                        ((DictionaryPropertyDescriptor<int> *)this);
      DVar10 = None;
      if (iVar6 != -1) {
        iVar6 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                          ((DictionaryPropertyDescriptor<int> *)this);
        pvVar9 = DynamicObject::GetSlot(instance,iVar6);
        *(Var *)propertyName._8_8_ = pvVar9;
        DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex
                  ((DictionaryPropertyDescriptor<int> *)this);
        DVar10 = Accessor;
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
      }
    }
    else {
      bVar1 = *(byte *)((long)&(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler + 1);
      DVar10 = WritableData;
      if ((bVar1 & 4) == 0) {
        DVar10 = (uint)(bVar1 >> 7) * 8 + Data;
      }
    }
  }
  return DVar10;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        DictionaryPropertyDescriptor<T>* descriptor;

        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            return GetSetterFromDescriptor<false>(instance, descriptor, setterValue, info);
        }

        return None;
    }